

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void parse_block(Parser *psr)

{
  Lexer *lxr;
  Local *pLVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FnScope *pFVar5;
  uint64_t uVar6;
  SavedLexer saved;
  bool bVar7;
  int iVar8;
  long lVar9;
  Node *left;
  Tk binop;
  int iVar10;
  Node NVar11;
  undefined1 local_70 [12];
  int iStack_64;
  int local_60;
  int iStack_5c;
  anon_union_8_2_0c43866c_for_TkInfo_4 aStack_58;
  int jmp_head;
  anon_union_8_6_f630ca3c_for_Node_1 local_48;
  Node local_40;
  
  iVar2 = psr->locals_count;
  iVar3 = psr->scope->next_slot;
  lxr = &psr->lxr;
LAB_00156c6f:
  iVar10 = (psr->lxr).tk.type;
  switch(iVar10) {
  case 0x10c:
    lex_next(lxr);
    lex_expect(lxr,0x114);
    uVar6 = (psr->lxr).tk.field_4.ident_hash;
    lVar9 = (long)psr->scope->first_local;
    while (lVar9 < psr->locals_count) {
      pLVar1 = psr->locals + lVar9;
      lVar9 = lVar9 + 1;
      if (pLVar1->name == uVar6) {
        psr_trigger_err(psr,"variable already defined");
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x573,"void parse_let(Parser *)");
      }
    }
    lex_next(lxr);
    lex_expect(lxr,0x3d);
    lex_next(lxr);
    NVar11 = parse_expr(psr);
    register0x00000010 = NVar11.field_1;
    local_70._0_4_ = NVar11.type;
    expr_to_next_slot(psr,(Node *)local_70);
    psr_new_local(psr,uVar6);
    goto LAB_00156c6f;
  case 0x10d:
    jmp_head = -1;
    do {
      lex_next(lxr);
      NVar11 = parse_expr(psr);
      register0x00000010 = NVar11.field_1;
      local_70._0_4_ = NVar11.type;
      expr_to_jmp(psr,(Node *)local_70);
      jmp_ensure_true_falls_through(psr,(Node *)local_70);
      jmp_list_patch(psr,local_70._8_4_,psr->vm->fns[psr->scope->fn].ins_count);
      lex_expect(lxr,0x7b);
      lex_next(lxr);
      parse_block(psr);
      lex_expect(lxr,0x7d);
      lex_next(lxr);
      if (((psr->lxr).tk.type & 0xfffffffeU) == 0x10e) {
        iVar10 = fn_emit(psr->vm->fns + psr->scope->fn,0x1d);
        jmp_list_append(psr,&jmp_head,iVar10);
      }
      jmp_list_patch(psr,iStack_64,psr->vm->fns[psr->scope->fn].ins_count);
      iVar10 = (psr->lxr).tk.type;
    } while (iVar10 == 0x10f);
    if (iVar10 == 0x10e) {
      lex_next(lxr);
      lex_expect(lxr,0x7b);
      lex_next(lxr);
      parse_block(psr);
      lex_expect(lxr,0x7d);
      lex_next(lxr);
    }
    iVar10 = psr->vm->fns[psr->scope->fn].ins_count;
    iVar8 = jmp_head;
    break;
  case 0x110:
    lex_next(lxr);
    iVar10 = psr->vm->fns[psr->scope->fn].ins_count;
    lex_expect(lxr,0x7b);
    lex_next(lxr);
    parse_block(psr);
    lex_expect(lxr,0x7d);
    lex_next(lxr);
    iVar8 = fn_emit(psr->vm->fns + psr->scope->fn,0x1e);
    jmp_set_target(psr,iVar8,iVar10);
    goto LAB_00156c6f;
  case 0x111:
    lex_next(lxr);
    iVar10 = psr->vm->fns[psr->scope->fn].ins_count;
    NVar11 = parse_expr(psr);
    register0x00000010 = NVar11.field_1;
    local_70._0_4_ = NVar11.type;
    expr_to_jmp(psr,(Node *)local_70);
    jmp_ensure_true_falls_through(psr,(Node *)local_70);
    jmp_list_patch(psr,local_70._8_4_,psr->vm->fns[psr->scope->fn].ins_count);
    lex_expect(lxr,0x7b);
    lex_next(lxr);
    parse_block(psr);
    lex_expect(lxr,0x7d);
    lex_next(lxr);
    iVar8 = fn_emit(psr->vm->fns + psr->scope->fn,0x1e);
    jmp_set_target(psr,iVar8,iVar10);
    iVar10 = psr->vm->fns[psr->scope->fn].ins_count;
    iVar8 = iStack_64;
    break;
  case 0x113:
    lex_next(lxr);
    lex_expect(lxr,0x114);
    uVar6 = (psr->lxr).tk.field_4.ident_hash;
    lex_next(lxr);
    iVar10 = parse_fn_args_body(psr);
    psr_new_local(psr,uVar6);
    pFVar5 = psr->scope;
    uVar4 = pFVar5->next_slot;
    pFVar5->next_slot = uVar4 + 1;
    fn_emit(psr->vm->fns + pFVar5->fn,(uVar4 & 0xff) * 0x100 + iVar10 * 0x10000 + 3);
    goto LAB_00156c6f;
  case 0x114:
    lex_save((SavedLexer *)local_70,lxr);
    lex_next(lxr);
    iVar10 = (psr->lxr).tk.type;
    saved.line = local_70._4_4_;
    saved.cursor = local_70._0_4_;
    saved.tk._0_8_ = stack0xffffffffffffff98;
    saved.tk.length = local_60;
    saved.tk.line = iStack_5c;
    saved.tk.field_4.num = aStack_58.num;
    lex_restore(lxr,saved);
    if ((iVar10 - 0x101U < 5) || (iVar10 == 0x3d)) {
      uVar6 = (psr->lxr).tk.field_4.ident_hash;
      lex_next(lxr);
      lVar9 = (long)psr->scope->first_local;
      iVar10 = 0;
      while( true ) {
        if (psr->locals_count <= lVar9) goto LAB_001571cf;
        if (psr->locals[lVar9].name == uVar6) break;
        lVar9 = lVar9 + 1;
        iVar10 = iVar10 + -1;
      }
      if (iVar10 == 1) {
LAB_001571cf:
        psr_trigger_err(psr,"variable not defined");
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x533,"void parse_assign(Parser *)");
      }
      binop = 0;
      switch((psr->lxr).tk.type) {
      case 0x101:
        binop = 0x2b;
        break;
      case 0x102:
        binop = 0x2d;
        break;
      case 0x103:
        binop = 0x2a;
        break;
      case 0x104:
        binop = 0x2f;
        break;
      default:
        bVar7 = true;
        goto LAB_00157108;
      }
      bVar7 = false;
LAB_00157108:
      lex_next(lxr);
      NVar11 = parse_expr(psr);
      local_48 = NVar11.field_1;
      jmp_head = NVar11.type;
      if (bVar7) {
        left = (Node *)&jmp_head;
      }
      else {
        local_40.type = NODE_NON_RELOC;
        local_40.field_1.slot = -(char)iVar10;
        left = &local_40;
        NVar11._4_4_ = 0;
        NVar11.type = jmp_head;
        NVar11.field_1 = local_48;
        expr_emit_arith(psr,binop,left,NVar11);
      }
      expr_to_slot(psr,-(char)iVar10,left);
    }
    else {
      parse_expr(psr);
    }
    goto LAB_00156c6f;
  default:
    if (iVar10 == 0x28) goto code_r0x00156cd4;
  case 0x10e:
  case 0x10f:
  case 0x112:
    psr->locals_count = iVar2;
    psr->scope->next_slot = iVar3;
    return;
  }
  jmp_list_patch(psr,iVar8,iVar10);
  goto LAB_00156c6f;
code_r0x00156cd4:
  parse_expr(psr);
  goto LAB_00156c6f;
}

Assistant:

static void parse_block(Parser *psr) {
	// Save the initial number of locals and the next slot, so we can discard
	// the locals created in this block once we reach the end of it
	int locals_count = psr->locals_count;
	int next_slot = psr->scope->next_slot;

	// Continually parse statements
	bool have_statement = true;
	while (have_statement) {
		switch (psr->lxr.tk.type) {
			case TK_LET:   parse_let(psr); break;
			case TK_IDENT: parse_assign_or_expr(psr); break;
			case '(':      parse_expr(psr); break;
			case TK_IF:    parse_if(psr); break;
			case TK_LOOP:  parse_loop(psr); break;
			case TK_WHILE: parse_while(psr); break;
			case TK_FN:    parse_fn(psr); break;

			// Couldn't find a statement to parse
		default:
			have_statement = false;
			break;
		}
	}

	// Discard all locals created in this block
	psr->locals_count = locals_count;
	psr->scope->next_slot = next_slot;
}